

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_util.c
# Opt level: O0

int print_mm_packet(int direction,mm_packet_t *pkt)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  int local_34;
  int status;
  mm_packet_t *pkt_local;
  int direction_local;
  
  local_34 = 0;
  pcVar2 = "T<--M";
  if (direction == 2) {
    pcVar2 = "T-->M";
  }
  pcVar1 = "TX";
  if (direction == 2) {
    pcVar1 = "RX";
  }
  pcVar3 = "---";
  if (((pkt->hdr).flags & 0x20) != 0) {
    pcVar3 = "DIS";
  }
  pcVar4 = "OK ";
  if (((pkt->hdr).flags & 0x10) != 0) {
    pcVar4 = "ERR";
  }
  pcVar6 = "REQ";
  if (((pkt->hdr).flags & 8) != 0) {
    pcVar6 = "ACK";
  }
  pcVar5 = " --- ";
  if (((pkt->hdr).flags & 4) != 0) {
    pcVar5 = "RETRY";
  }
  printf("\n%s %s: flags=%02x [ %s | %s | %s | %s | Seq:%d], len=%3d (datalen=%3d), crc=%04x.\n",
         pcVar2,pcVar1,(ulong)(pkt->hdr).flags,pcVar3,pcVar4,pcVar6,pcVar5,(pkt->hdr).flags & 3,
         (uint)(pkt->hdr).pktlen,(uint)pkt->payload_len,(uint)(pkt->trailer).crc);
  if ((pkt->trailer).crc != pkt->calculated_crc) {
    printf("\t*** CRC Error, calculated: %04x ***\n",(ulong)pkt->calculated_crc);
    local_34 = -1;
  }
  if ((pkt->trailer).end != '\x03') {
    printf("\t*** Framing Error, expected STOP=0x03, got STOP=%02x ***\n",(ulong)(pkt->trailer).end)
    ;
    local_34 = -1;
  }
  if (pkt->payload_len != '\0') {
    dump_hex(pkt->payload,(ulong)pkt->payload_len);
  }
  return local_34;
}

Assistant:

int print_mm_packet(int direction, mm_packet_t *pkt) {
    int status = 0;

    /* Decode flags: bit 3 = Req/Ack, 2=Retry, 1:0=Sequence. */
    printf("\n%s %s: flags=%02x [ %s | %s | %s | %s | Seq:%d], len=%3d (datalen=%3d), crc=%04x.\n",
           (direction == RX) ? "T-->M" : "T<--M",
           (direction == RX) ? "RX" : "TX",
           pkt->hdr.flags,
           (pkt->hdr.flags & FLAG_DISCONNECT) ? "DIS" : "---",
           (pkt->hdr.flags & FLAG_STATUS) ? "ERR" : "OK ",
           (pkt->hdr.flags & FLAG_ACK) ? "ACK" : "REQ",
           (pkt->hdr.flags & FLAG_RETRY) ? "RETRY" : " --- ",
           (pkt->hdr.flags & FLAG_SEQUENCE),
           pkt->hdr.pktlen, pkt->payload_len, LE16(pkt->trailer.crc));

    if (pkt->trailer.crc != pkt->calculated_crc) {
        printf("\t*** CRC Error, calculated: %04x ***\n", pkt->calculated_crc);
        status = -1;
    }

    if (pkt->trailer.end != STOP_BYTE) {
        printf("\t*** Framing Error, expected STOP=0x03, got STOP=%02x ***\n", pkt->trailer.end);
        status = -1;
    }

    if (pkt->payload_len > 0) {
        dump_hex(pkt->payload, pkt->payload_len);
    }

    return status;
}